

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.hpp
# Opt level: O3

Path<SimpleState_*> * __thiscall
xmotion::Dijkstra::Search<SimpleState*,double,SimpleStateIndexer,int>
          (Path<SimpleState_*> *__return_storage_ptr__,Dijkstra *this,
          Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph,int start,int goal)

{
  pointer *pppSVar1;
  undefined8 *puVar2;
  long lVar3;
  SimpleState **__args;
  iterator __position;
  pointer pvVar4;
  iterator graph_00;
  iterator start_vtx;
  GetNeighbourFunc_t<SimpleState_*,_double> *in_R9;
  vertex_iterator *wp;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  path_vtx;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  
  for (puVar2 = *(undefined8 **)(this + 0x18); puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    lVar3 = puVar2[2];
    *(undefined2 *)(lVar3 + 0x48) = 0;
    *(undefined8 *)(lVar3 + 0x68) = 0;
    *(undefined8 *)(lVar3 + 0x50) = 0x7fefffffffffffff;
    *(undefined8 *)(lVar3 + 0x58) = 0x7fefffffffffffff;
    *(undefined8 *)(lVar3 + 0x60) = 0x7fefffffffffffff;
  }
  local_70.
  super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(long)(int)graph;
  graph_00 = std::
             _Hashtable<long,_std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<long,_std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(this + 8),(key_type *)&local_70);
  local_70.
  super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(long)start;
  start_vtx = std::
              _Hashtable<long,_std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<long,_std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(this + 8),(key_type *)&local_70);
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (start_vtx.
      super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
      ._M_cur != (__node_type *)0x0 &&
      graph_00.
      super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
      ._M_cur != (__node_type *)0x0) {
    local_58 = 0;
    uStack_50 = 0;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    PerformSearch<SimpleState*,double,SimpleStateIndexer>
              (&local_70,this,
               (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)
               graph_00.
               super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
               ._M_cur,(vertex_iterator)
                       start_vtx.
                       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                       ._M_cur,(vertex_iterator)&local_58,in_R9);
    pvVar4 = local_70.
             super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
      pvVar4 = local_70.
               super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; pvVar4 != local_70.
                     super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pvVar4 = pvVar4 + 1) {
      __args = *(SimpleState ***)
                ((long)&(((pvVar4->super_const_vertex_iterator).super_VertexMapTypeIterator.
                          super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                         ._M_cur)->
                        super__Hash_node_value<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>
                        ._M_storage._M_storage + 8);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<SimpleState*,std::allocator<SimpleState*>>::
        _M_realloc_insert<SimpleState*const&>
                  ((vector<SimpleState*,std::allocator<SimpleState*>> *)__return_storage_ptr__,
                   __position,__args);
      }
      else {
        *__position._M_current = *__args;
        pppSVar1 = &(__return_storage_ptr__->
                    super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
    }
    if (local_70.
        super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.
                      super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Path<State> Search(Graph<State, Transition, StateIndexer> *graph,
                            VertexIdentifier start, VertexIdentifier goal) {
    // reset last search information
    graph->ResetAllVertices();

    auto start_it = graph->FindVertex(start);
    auto goal_it = graph->FindVertex(goal);

    Path<State> path;
    // start a new search and return result
    if (start_it != graph->vertex_end() && goal_it != graph->vertex_end()) {
      auto path_vtx = PerformSearch(graph, start_it, goal_it);
      for (auto &wp : path_vtx) path.push_back(wp->state);
    }
    return path;
  }